

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmValue * CompileVmArraySetup(ExpressionContext *ctx,VmModule *module,ExprArraySetup *node)

{
  TypeBase *pTVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  SynBase *pSVar4;
  Allocator *pAVar5;
  int iVar6;
  VmValue *pVVar7;
  VmValue *pVVar8;
  VmConstant *address;
  VmBlock *block;
  VmBlock *block_00;
  VmBlock *block_01;
  VmConstant *pVVar9;
  VmValue *pVVar10;
  TypeRef *structType;
  undefined4 extraout_var;
  uint offset;
  
  pTVar1 = node->lhs->type;
  if ((pTVar1 == (TypeBase *)0x0) || (pTVar1->typeID != 0x12)) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xdb8,
                  "VmValue *CompileVmArraySetup(ExpressionContext &, VmModule *, ExprArraySetup *)")
    ;
  }
  pp_Var2 = pTVar1[1]._vptr_TypeBase;
  if ((pp_Var2 != (_func_int **)0x0) && (*(int *)(pp_Var2 + 1) == 0x13)) {
    pVVar7 = CompileVm(ctx,module,node->initializer);
    pVVar8 = CompileVm(ctx,module,node->lhs);
    p_Var3 = pp_Var2[0xc];
    if ((p_Var3 == (_func_int *)0x0) || (6 < *(int *)(p_Var3 + 8) - 2U)) {
      address = anon_unknown.dwarf_12e14a::CreateAlloca
                          (ctx,module,(node->super_ExprBase).source,ctx->typeInt,"arr_it",true);
      block = anon_unknown.dwarf_12e14a::CreateBlock
                        (module,(node->super_ExprBase).source,"arr_setup_cond");
      block_00 = anon_unknown.dwarf_12e14a::CreateBlock
                           (module,(node->super_ExprBase).source,"arr_setup_body");
      block_01 = anon_unknown.dwarf_12e14a::CreateBlock
                           (module,(node->super_ExprBase).source,"arr_setup_exit");
      pSVar4 = (node->super_ExprBase).source;
      pTVar1 = ctx->typeInt;
      pVVar9 = CreateConstantInt(module->allocator,pSVar4,0);
      anon_unknown.dwarf_12e14a::CreateStore
                (ctx,module,pSVar4,pTVar1,&address->super_VmValue,&pVVar9->super_VmValue,0);
      offset = (uint)pVVar9;
      anon_unknown.dwarf_12e14a::CreateJump
                (module,(node->super_ExprBase).source,&block->super_VmValue);
      VmFunction::AddBlock(module->currentFunction,block);
      module->currentBlock = block;
      if ((long)(int)(*(long *)(pp_Var2[0xc] + 0x30) * (long)pp_Var2[0xd]) !=
          *(long *)(pp_Var2[0xc] + 0x30) * (long)pp_Var2[0xd]) {
        __assert_fail("int(arrayType->length * arrayType->subType->size) == arrayType->length * arrayType->subType->size"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0xdd6,
                      "VmValue *CompileVmArraySetup(ExpressionContext &, VmModule *, ExprArraySetup *)"
                     );
      }
      pSVar4 = (node->super_ExprBase).source;
      pVVar10 = anon_unknown.dwarf_12e14a::CreateLoad
                          (ctx,module,pSVar4,ctx->typeInt,&address->super_VmValue,offset);
      pVVar9 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,
                                 *(int *)(pp_Var2[0xc] + 0x30) * *(int *)(pp_Var2 + 0xd));
      pVVar10 = anon_unknown.dwarf_12e14a::CreateCompareLess
                          (module,pSVar4,pVVar10,&pVVar9->super_VmValue);
      anon_unknown.dwarf_12e14a::CreateJumpNotZero
                (module,(node->super_ExprBase).source,pVVar10,&block_00->super_VmValue,
                 &block_01->super_VmValue);
      VmFunction::AddBlock(module->currentFunction,block_00);
      module->currentBlock = block_00;
      pVVar10 = anon_unknown.dwarf_12e14a::CreateLoad
                          (ctx,module,(node->super_ExprBase).source,ctx->typeInt,
                           &address->super_VmValue,offset);
      pSVar4 = (node->super_ExprBase).source;
      pTVar1 = (TypeBase *)pp_Var2[0xc];
      structType = ExpressionContext::GetReferenceType(ctx,pTVar1);
      pVVar8 = anon_unknown.dwarf_12e14a::CreateMemberAccess
                         (module,pSVar4,pVVar8,pVVar10,&structType->super_TypeBase,
                          (InplaceStr)ZEXT816(0));
      anon_unknown.dwarf_12e14a::CreateStore(ctx,module,pSVar4,pTVar1,pVVar8,pVVar7,0);
      pSVar4 = (node->super_ExprBase).source;
      pTVar1 = ctx->typeInt;
      pVVar9 = CreateConstantInt(module->allocator,pSVar4,*(int *)(pp_Var2[0xc] + 0x30));
      pVVar7 = anon_unknown.dwarf_12e14a::CreateAdd(module,pSVar4,pVVar10,&pVVar9->super_VmValue);
      anon_unknown.dwarf_12e14a::CreateStore
                (ctx,module,pSVar4,pTVar1,&address->super_VmValue,pVVar7,0);
      anon_unknown.dwarf_12e14a::CreateJump
                (module,(node->super_ExprBase).source,&block->super_VmValue);
      VmFunction::AddBlock(module->currentFunction,block_01);
      module->currentBlock = block_01;
      iVar6 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x98);
      pVVar7 = (VmValue *)CONCAT44(extraout_var,iVar6);
      pAVar5 = module->allocator;
      pVVar7->typeID = 0;
      pVVar7->source = (SynBase *)0x0;
      (pVVar7->comment).begin = (char *)0x0;
      (pVVar7->type).type = VM_TYPE_VOID;
      (pVVar7->type).size = 0;
      (pVVar7->type).structType = (TypeBase *)0x0;
      (pVVar7->comment).end = (char *)0x0;
      (pVVar7->users).allocator = pAVar5;
      (pVVar7->users).data = (pVVar7->users).little;
      (pVVar7->users).count = 0;
      (pVVar7->users).max = 8;
      pVVar7->hasKnownNonSimpleUse = false;
      pVVar7->hasSideEffects = false;
      pVVar7->hasMemoryAccess = false;
      pVVar7->canBeRemoved = true;
      pVVar7->hasKnownSimpleUse = false;
      pVVar7->_vptr_VmValue = (_func_int **)&PTR__VmValue_00241c60;
    }
    else {
      pVVar7 = anon_unknown.dwarf_12e14a::CreateSetRange
                         (module,(node->super_ExprBase).source,pVVar8,*(int *)(pp_Var2 + 0xd),pVVar7
                          ,*(int *)(p_Var3 + 0x30));
    }
    pVVar7 = anon_unknown.dwarf_12e14a::CheckType
                       (ctx,(ExprBase *)(node->super_ExprBase).type,pVVar7);
    return pVVar7;
  }
  __assert_fail("arrayType",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0xdbc,
                "VmValue *CompileVmArraySetup(ExpressionContext &, VmModule *, ExprArraySetup *)");
}

Assistant:

VmValue* CompileVmArraySetup(ExpressionContext &ctx, VmModule *module, ExprArraySetup *node)
{
	TypeRef *refType = getType<TypeRef>(node->lhs->type);

	assert(refType);

	TypeArray *arrayType = getType<TypeArray>(refType->subType);

	assert(arrayType);

	VmValue *initializer = CompileVm(ctx, module, node->initializer);

	VmValue *address = CompileVm(ctx, module, node->lhs);

	TypeBase *elementType = arrayType->subType;

	// Fast memset for supported types
	if(isType<TypeBool>(elementType) || isType<TypeChar>(elementType) || isType<TypeShort>(elementType) || isType<TypeInt>(elementType) || isType<TypeLong>(elementType) || isType<TypeFloat>(elementType) || isType<TypeDouble>(elementType))
		return CheckType(ctx, node, CreateSetRange(module, node->source, address, int(arrayType->length), initializer, int(elementType->size)));

	VmValue *offsetPtr = CreateAlloca(ctx, module, node->source, ctx.typeInt, "arr_it", true);

	VmBlock *conditionBlock = CreateBlock(module, node->source, "arr_setup_cond");
	VmBlock *bodyBlock = CreateBlock(module, node->source, "arr_setup_body");
	VmBlock *exitBlock = CreateBlock(module, node->source, "arr_setup_exit");

	CreateStore(ctx, module, node->source, ctx.typeInt, offsetPtr, CreateConstantInt(module->allocator, node->source, 0), 0);

	CreateJump(module, node->source, conditionBlock);

	module->currentFunction->AddBlock(conditionBlock);
	module->currentBlock = conditionBlock;

	// Offset will move in element size steps, so it will reach the full size of the array
	assert(int(arrayType->length * arrayType->subType->size) == arrayType->length * arrayType->subType->size);

	// While offset is less than array size
	VmValue* condition = CreateCompareLess(module, node->source, CreateLoad(ctx, module, node->source, ctx.typeInt, offsetPtr, 0), CreateConstantInt(module->allocator, node->source, int(arrayType->length * arrayType->subType->size)));

	CreateJumpNotZero(module, node->source, condition, bodyBlock, exitBlock);

	module->currentFunction->AddBlock(bodyBlock);
	module->currentBlock = bodyBlock;

	VmValue *offset = CreateLoad(ctx, module, node->source, ctx.typeInt, offsetPtr, 0);

	CreateStore(ctx, module, node->source, arrayType->subType, CreateMemberAccess(module, node->source, address, offset, ctx.GetReferenceType(arrayType->subType), InplaceStr()), initializer, 0);
	CreateStore(ctx, module, node->source, ctx.typeInt, offsetPtr, CreateAdd(module, node->source, offset, CreateConstantInt(module->allocator, node->source, int(arrayType->subType->size))), 0);

	CreateJump(module, node->source, conditionBlock);

	module->currentFunction->AddBlock(exitBlock);
	module->currentBlock = exitBlock;

	return CheckType(ctx, node, CreateVoid(module));
}